

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

HT_ErrorCode ht_stack_init(HT_Stack *stack,size_t capacity,size_t n_capacity)

{
  void *pvVar1;
  HT_ErrorCode bag_init_err;
  size_t n_capacity_local;
  size_t capacity_local;
  HT_Stack *stack_local;
  
  pvVar1 = ht_alloc(capacity);
  stack->data = pvVar1;
  if (stack->data == (void *)0x0) {
    stack_local._4_4_ = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    stack_local._4_4_ = ht_bag_void_ptr_init(&stack->sizes_stack,n_capacity);
    if (stack_local._4_4_ == HT_ERR_OK) {
      stack->size = 0;
      stack->capacity = capacity;
      stack->min_capacity = capacity;
      stack_local._4_4_ = HT_ERR_OK;
    }
    else {
      ht_free(stack->data);
    }
  }
  return stack_local._4_4_;
}

Assistant:

HT_ErrorCode ht_stack_init(HT_Stack* stack, size_t capacity, size_t n_capacity)
{
    HT_ErrorCode bag_init_err = HT_ERR_OK;

    stack->data = ht_alloc(capacity);

    if (stack->data == NULL)
    {
        return HT_ERR_OUT_OF_MEMORY;
    }

    bag_init_err = ht_bag_void_ptr_init(&stack->sizes_stack, n_capacity);
    if (bag_init_err != HT_ERR_OK)
    {
        ht_free(stack->data);
        return bag_init_err;
    }

    stack->size = 0;
    stack->capacity = capacity;
    stack->min_capacity = capacity;

    return HT_ERR_OK;
}